

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *window;
  bool popup_hierarchy_00;
  bool dock_hierarchy_00;
  bool dock_hierarchy;
  ImGuiWindow *pIStack_28;
  bool popup_hierarchy;
  ImGuiWindow *cur_window;
  ImGuiWindow *ref_window;
  ImGuiContext *g;
  ImGuiFocusedFlags flags_local;
  
  window = GImGui->NavWindow;
  pIStack_28 = GImGui->CurrentWindow;
  if (window == (ImGuiWindow *)0x0) {
    g._7_1_ = false;
  }
  else if ((flags & 4U) == 0) {
    if (pIStack_28 == (ImGuiWindow *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1dbf,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
    }
    popup_hierarchy_00 = (flags & 8U) == 0;
    dock_hierarchy_00 = (flags & 0x10U) != 0;
    if ((flags & 2U) != 0) {
      pIStack_28 = GetCombinedRootWindow(pIStack_28,popup_hierarchy_00,dock_hierarchy_00);
    }
    if ((flags & 1U) == 0) {
      g._7_1_ = window == pIStack_28;
    }
    else {
      g._7_1_ = IsWindowChildOf(window,pIStack_28,popup_hierarchy_00,dock_hierarchy_00);
    }
  }
  else {
    g._7_1_ = true;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    const bool dock_hierarchy = (flags & ImGuiFocusedFlags_DockHierarchy) != 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
    else
        return (ref_window == cur_window);
}